

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O1

void gravity_hash_free(gravity_hash_t *hashtable)

{
  gravity_hash_iterate_fn p_Var1;
  hash_node_t *__ptr;
  hash_node_s *phVar2;
  ulong uVar3;
  
  if (hashtable == (gravity_hash_t *)0x0) {
    return;
  }
  if (hashtable->size != 0) {
    p_Var1 = hashtable->free_fn;
    uVar3 = 0;
    do {
      __ptr = hashtable->nodes[uVar3];
      hashtable->nodes[uVar3] = (hash_node_t *)0x0;
      while (__ptr != (hash_node_t *)0x0) {
        if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
          (*p_Var1)(hashtable,__ptr->key,__ptr->value,hashtable->data);
        }
        phVar2 = __ptr->next;
        free(__ptr);
        __ptr = phVar2;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < hashtable->size);
  }
  free(hashtable->nodes);
  free(hashtable);
  return;
}

Assistant:

void gravity_hash_free (gravity_hash_t *hashtable) {
    if (!hashtable) return;
    gravity_hash_iterate_fn free_fn = hashtable->free_fn;

    for (uint32_t n = 0; n < hashtable->size; ++n) {
        hash_node_t *node = hashtable->nodes[n];
        hashtable->nodes[n] = NULL;
        while (node) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            hash_node_t *old_node = node;
            node = node->next;
            mem_free(old_node);
        }
    }
    mem_free(hashtable->nodes);
    mem_free(hashtable);
    hashtable = NULL;
}